

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

Station * __thiscall imrt::Station::operator=(Station *this,Station *s)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type pMVar3;
  int iVar4;
  int iVar5;
  mapped_type *ppMVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  Matrix local_40;
  
  Collimator::operator=(this->collimator,s->collimator);
  this->angle = s->angle;
  iVar2 = s->max_intensity;
  iVar4 = s->min_intensity;
  iVar5 = s->initial_intensity;
  this->max_apertures = s->max_apertures;
  this->max_intensity = iVar2;
  this->min_intensity = iVar4;
  this->initial_intensity = iVar5;
  this->step_intensity = s->step_intensity;
  iVar2 = s->n_volumes;
  this->n_volumes = iVar2;
  local_40.rows_ = 0;
  if (0 < iVar2) {
    p_Var1 = &(s->D)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var8 = (s->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      p_Var9 = p_Var1;
      if (p_Var8 != (_Base_ptr)0x0) {
        do {
          if (local_40.rows_ <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < local_40.rows_];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var9 = (_Rb_tree_header *)p_Var7,
           local_40.rows_ < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var9 = p_Var1;
        }
      }
      pMVar3 = *(mapped_type *)(p_Var9 + 1);
      ppMVar6 = std::
                map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                ::operator[](&this->D,&local_40.rows_);
      *ppMVar6 = pMVar3;
      local_40.rows_ = local_40.rows_ + 1;
    } while (local_40.rows_ < this->n_volumes);
  }
  maths::Matrix::Matrix(&local_40,&s->I);
  maths::Matrix::operator=(&this->I,&local_40);
  maths::Matrix::~Matrix(&local_40);
  std::vector<double,_std::allocator<double>_>::operator=(&this->intensity,&s->intensity);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::operator=(&this->A,&s->A);
  (this->last_mem).first = (s->last_mem).first;
  (this->last_mem).second = (s->last_mem).second;
  if (this != s) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              ((list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff
               ,(s->last_diff).
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node.super__List_node_base._M_next,&s->last_diff);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::operator=(&(this->pos2beam)._M_t,&(s->pos2beam)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::operator=(&(this->beam2pos)._M_t,&(s->beam2pos)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(this->int2nb)._M_t,&(s->int2nb)._M_t);
  return this;
}

Assistant:

Station& Station::operator=(const Station & s) {
    collimator=s.collimator;
    angle=s.angle;
    max_apertures=s.max_apertures;
    max_intensity=s.max_intensity;
    min_intensity=s.min_intensity;
    initial_intensity=s.initial_intensity;
    step_intensity=s.step_intensity;
    n_volumes=s.n_volumes;
    for (int i=0; i<n_volumes; i++) {
      const Matrix * aux= s.D.find(i)->second;
      D[i]=aux;
    }
    I= Matrix (s.I);
    //I= s.I;
    intensity=s.intensity;
    A=s.A;
    last_mem=s.last_mem;
    last_diff=s.last_diff;
    pos2beam=s.pos2beam;
    beam2pos=s.beam2pos;
    int2nb=s.int2nb;

    return(*this);
  }